

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void wabt::WriteType(Stream *stream,Type type,char *desc)

{
  char *stream_00;
  bool bVar1;
  Index value;
  char *local_a0;
  char *local_88;
  string local_70;
  byte local_49;
  string local_48;
  Type local_28;
  char *local_20;
  char *desc_local;
  Stream *stream_local;
  Type type_local;
  
  local_49 = 0;
  local_88 = desc;
  local_28 = type;
  local_20 = desc;
  desc_local = (char *)stream;
  stream_local = (Stream *)type;
  if (desc == (char *)0x0) {
    Type::GetName_abi_cxx11_(&local_48,(Type *)&stream_local);
    local_49 = 1;
    local_88 = (char *)std::__cxx11::string::c_str();
  }
  WriteS32Leb128<wabt::Type>(stream,local_28,local_88);
  if ((local_49 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  bVar1 = Type::IsReferenceWithIndex((Type *)&stream_local);
  stream_00 = desc_local;
  if (bVar1) {
    value = Type::GetReferenceIndex((Type *)&stream_local);
    bVar1 = local_20 == (char *)0x0;
    if (bVar1) {
      Type::GetName_abi_cxx11_(&local_70,(Type *)&stream_local);
      local_a0 = (char *)std::__cxx11::string::c_str();
    }
    else {
      local_a0 = local_20;
    }
    WriteS32Leb128((Stream *)stream_00,value,local_a0);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void WriteType(Stream* stream, Type type, const char* desc) {
  WriteS32Leb128(stream, type, desc ? desc : type.GetName().c_str());
  if (type.IsReferenceWithIndex()) {
    WriteS32Leb128(stream, type.GetReferenceIndex(),
                   desc ? desc : type.GetName().c_str());
  }
}